

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

uchar * stbi__convert_format(uchar *data,int img_n,int req_comp,uint x,uint y)

{
  int iVar1;
  byte bVar2;
  uchar uVar3;
  uchar *puVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  byte *pbVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  byte *pbVar14;
  uint uVar15;
  
  puVar4 = data;
  if (req_comp != img_n) {
    if (3 < req_comp - 1U) {
      __assert_fail("req_comp >= 1 && req_comp <= 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                    ,0x634,
                    "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                   );
    }
    puVar4 = (uchar *)stbi__malloc_mad3(req_comp,x,y,0);
    if (puVar4 == (uchar *)0x0) {
      free(data);
      stbi__g_failure_reason = "outofmem";
      puVar4 = (uchar *)0x0;
    }
    else {
      if (0 < (int)y) {
        uVar10 = req_comp + img_n * 8;
        if ((0x23 < uVar10) || ((0xe161a1c00U >> ((ulong)uVar10 & 0x3f) & 1) == 0)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/einsteinx2[P]glex/deps/shared/stb/stb_image.h"
                        ,0x651,
                        "unsigned char *stbi__convert_format(unsigned char *, int, int, unsigned int, unsigned int)"
                       );
        }
        uVar5 = 1;
        if (1 < (int)y) {
          uVar5 = (ulong)y;
        }
        iVar1 = x - 1;
        uVar13 = 0;
        uVar15 = 0;
        uVar12 = 0;
        do {
          iVar7 = (int)uVar12 * x;
          pbVar14 = data + (uint)(iVar7 * img_n);
          pbVar8 = puVar4 + (uint)(iVar7 * req_comp);
          if (uVar10 - 10 < 0x19) {
            uVar11 = (ulong)uVar15;
            switch(uVar10) {
            case 10:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar6 = x;
                do {
                  puVar4[lVar9 * 2 + uVar11] = data[lVar9 + uVar13];
                  puVar4[lVar9 * 2 + uVar11 + 1] = 0xff;
                  uVar6 = uVar6 - 1;
                  lVar9 = lVar9 + 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0xb:
              if (-1 < iVar1) {
                pbVar8 = puVar4 + uVar11 + 2;
                uVar6 = x;
                do {
                  bVar2 = *pbVar14;
                  *pbVar8 = bVar2;
                  pbVar8[-1] = bVar2;
                  pbVar8[-2] = bVar2;
                  pbVar14 = pbVar14 + 1;
                  uVar6 = uVar6 - 1;
                  pbVar8 = pbVar8 + 3;
                } while (0 < (int)uVar6);
              }
              break;
            case 0xc:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar6 = x;
                do {
                  uVar3 = data[lVar9 + uVar13];
                  puVar4[lVar9 * 4 + uVar11 + 2] = uVar3;
                  puVar4[lVar9 * 4 + uVar11 + 1] = uVar3;
                  puVar4[lVar9 * 4 + uVar11] = uVar3;
                  puVar4[lVar9 * 4 + uVar11 + 3] = 0xff;
                  uVar6 = uVar6 - 1;
                  lVar9 = lVar9 + 1;
                } while (0 < (int)uVar6);
              }
              break;
            default:
              goto switchD_0012a173_caseD_d;
            case 0x11:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar6 = x;
                do {
                  puVar4[lVar9 + uVar11] = data[lVar9 * 2 + uVar13];
                  uVar6 = uVar6 - 1;
                  lVar9 = lVar9 + 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x13:
              if (-1 < iVar1) {
                pbVar8 = puVar4 + uVar11 + 2;
                uVar6 = x;
                do {
                  bVar2 = *pbVar14;
                  *pbVar8 = bVar2;
                  pbVar8[-1] = bVar2;
                  pbVar8[-2] = bVar2;
                  pbVar14 = pbVar14 + 2;
                  uVar6 = uVar6 - 1;
                  pbVar8 = pbVar8 + 3;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x14:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar6 = x;
                do {
                  uVar3 = data[lVar9 + uVar13];
                  puVar4[lVar9 * 2 + uVar11 + 2] = uVar3;
                  puVar4[lVar9 * 2 + uVar11 + 1] = uVar3;
                  puVar4[lVar9 * 2 + uVar11] = uVar3;
                  puVar4[lVar9 * 2 + uVar11 + 3] = data[lVar9 + uVar13 + 1];
                  uVar6 = uVar6 - 1;
                  lVar9 = lVar9 + 2;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x19:
              uVar6 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar14[2];
                  *pbVar8 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar14[1] * 0x96 + (uint)*pbVar14 * 0x4d >> 8);
                  pbVar14 = pbVar14 + 3;
                  pbVar8 = pbVar8 + 1;
                  uVar6 = uVar6 - 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x1a:
              uVar6 = x;
              if (-1 < iVar1) {
                do {
                  bVar2 = pbVar14[2];
                  *pbVar8 = (byte)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                                   (uint)pbVar14[1] * 0x96 + (uint)*pbVar14 * 0x4d >> 8);
                  pbVar8[1] = 0xff;
                  pbVar14 = pbVar14 + 3;
                  pbVar8 = pbVar8 + 2;
                  uVar6 = uVar6 - 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x1c:
              uVar6 = x;
              if (-1 < iVar1) {
                do {
                  *pbVar8 = *pbVar14;
                  pbVar8[1] = pbVar14[1];
                  pbVar8[2] = pbVar14[2];
                  pbVar8[3] = 0xff;
                  pbVar14 = pbVar14 + 3;
                  pbVar8 = pbVar8 + 4;
                  uVar6 = uVar6 - 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x21:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar6 = x;
                do {
                  bVar2 = data[lVar9 * 4 + uVar13 + 2];
                  puVar4[lVar9 + uVar11] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar9 * 4 + uVar13 + 1] * 0x96 +
                               (uint)data[lVar9 * 4 + uVar13] * 0x4d >> 8);
                  uVar6 = uVar6 - 1;
                  lVar9 = lVar9 + 1;
                } while (0 < (int)uVar6);
              }
              break;
            case 0x22:
              if (-1 < iVar1) {
                lVar9 = 0;
                uVar6 = x;
                do {
                  bVar2 = data[lVar9 * 2 + uVar13 + 2];
                  puVar4[lVar9 + uVar11] =
                       (uchar)((uint)bVar2 * 2 + ((uint)bVar2 + (uint)bVar2 * 8) * 3 +
                               (uint)data[lVar9 * 2 + uVar13 + 1] * 0x96 +
                               (uint)data[lVar9 * 2 + uVar13] * 0x4d >> 8);
                  puVar4[lVar9 + uVar11 + 1] = data[lVar9 * 2 + uVar13 + 3];
                  uVar6 = uVar6 - 1;
                  lVar9 = lVar9 + 2;
                } while (0 < (int)uVar6);
              }
            }
          }
          else {
switchD_0012a173_caseD_d:
            uVar6 = x;
            if (-1 < iVar1) {
              do {
                *pbVar8 = *pbVar14;
                pbVar8[1] = pbVar14[1];
                pbVar8[2] = pbVar14[2];
                pbVar14 = pbVar14 + 4;
                pbVar8 = pbVar8 + 3;
                uVar6 = uVar6 - 1;
              } while (0 < (int)uVar6);
            }
          }
          uVar12 = uVar12 + 1;
          uVar15 = uVar15 + x * req_comp;
          uVar13 = (ulong)((int)uVar13 + x * img_n);
        } while (uVar12 != uVar5);
      }
      free(data);
    }
  }
  return puVar4;
}

Assistant:

static unsigned char *stbi__convert_format(unsigned char *data, int img_n, int req_comp, unsigned int x, unsigned int y)
{
   int i,j;
   unsigned char *good;

   if (req_comp == img_n) return data;
   STBI_ASSERT(req_comp >= 1 && req_comp <= 4);

   good = (unsigned char *) stbi__malloc_mad3(req_comp, x, y, 0);
   if (good == NULL) {
      STBI_FREE(data);
      return stbi__errpuc("outofmem", "Out of memory");
   }

   for (j=0; j < (int) y; ++j) {
      unsigned char *src  = data + j * x * img_n   ;
      unsigned char *dest = good + j * x * req_comp;

      #define STBI__COMBO(a,b)  ((a)*8+(b))
      #define STBI__CASE(a,b)   case STBI__COMBO(a,b): for(i=x-1; i >= 0; --i, src += a, dest += b)
      // convert source image with img_n components to one with req_comp components;
      // avoid switch per pixel, so use switch per scanline and massive macros
      switch (STBI__COMBO(img_n, req_comp)) {
         STBI__CASE(1,2) { dest[0]=src[0]; dest[1]=255;                                     } break;
         STBI__CASE(1,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(1,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=255;                     } break;
         STBI__CASE(2,1) { dest[0]=src[0];                                                  } break;
         STBI__CASE(2,3) { dest[0]=dest[1]=dest[2]=src[0];                                  } break;
         STBI__CASE(2,4) { dest[0]=dest[1]=dest[2]=src[0]; dest[3]=src[1];                  } break;
         STBI__CASE(3,4) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];dest[3]=255;        } break;
         STBI__CASE(3,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(3,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = 255;    } break;
         STBI__CASE(4,1) { dest[0]=stbi__compute_y(src[0],src[1],src[2]);                   } break;
         STBI__CASE(4,2) { dest[0]=stbi__compute_y(src[0],src[1],src[2]); dest[1] = src[3]; } break;
         STBI__CASE(4,3) { dest[0]=src[0];dest[1]=src[1];dest[2]=src[2];                    } break;
         default: STBI_ASSERT(0);
      }
      #undef STBI__CASE
   }

   STBI_FREE(data);
   return good;
}